

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsops.c
# Opt level: O0

LispPTR LCGetIVValue(LispPTR object,LispPTR iv)

{
  uint uVar1;
  LispPTR LVar2;
  LispPTR *pLVar3;
  LCIVCacheEntry *pLVar4;
  uint local_38;
  LispPTR local_34;
  int i;
  LispPTR iNames;
  LCIVCacheEntry *ce;
  int index;
  LispPTR val;
  LCInstance *objptr;
  LispPTR iv_local;
  LispPTR object_local;
  
  if (atom_instance == 0) {
    LCinit();
  }
  if ((*(uint *)(DTDspace +
                (long)(int)((*(ushort *)((ulong)(MDStypetbl + (object >> 9)) ^ 2) & 0x7ff) << 4) +
                (long)(int)((*(ushort *)((ulong)(MDStypetbl + (object >> 9)) ^ 2) & 0x7ff) << 1)) &
      0xfffffff) == atom_instance) {
    pLVar3 = NativeAligned4FromLAddr(object);
    local_34 = pLVar3[1];
    pLVar4 = LCIVCache + ((local_34 ^ iv) & 0x3ff);
    if ((pLVar4->iNames == local_34) && (pLVar4->iv == iv)) {
      ce._0_4_ = pLVar4->index & 0xffff;
LAB_0015031a:
      pLVar3 = NativeAligned4FromLAddr(pLVar3[2]);
      uVar1 = pLVar3[(int)(uint)ce];
      if ((*(uint *)(DTDspace +
                    (long)(int)((*(ushort *)((ulong)(MDStypetbl + (uVar1 >> 9)) ^ 2) & 0x7ff) << 4)
                    + (long)(int)((*(ushort *)((ulong)(MDStypetbl + (uVar1 >> 9)) ^ 2) & 0x7ff) << 1
                                 )) & 0xfffffff) != atom_annotatedValue) {
        return uVar1;
      }
    }
    else if ((*(ushort *)((ulong)(MDStypetbl + (local_34 >> 9)) ^ 2) & 0x7ff) == 5) {
      local_38 = 0;
      do {
        LVar2 = car(local_34);
        if (LVar2 == iv) {
          pLVar4->iNames = pLVar3[1];
          pLVar4->iv = iv;
          pLVar4->index = local_38 | 0xe0000;
          ce._0_4_ = local_38;
          goto LAB_0015031a;
        }
        local_38 = local_38 + 1;
        local_34 = cdr(local_34);
      } while (local_34 != 0);
    }
    iv_local = lcfuncall(atom_GetIVValue_LCUFN,2,3);
  }
  else {
    iv_local = lcfuncall(atom_GetIVValue_LCUFN,2,3);
  }
  return iv_local;
}

Assistant:

LispPTR LCGetIVValue(LispPTR object, LispPTR iv) {
  struct LCInstance *objptr;
  LispPTR val;
  int index;

  LC_INIT;
  INSTANCE_OR_PUNT(object, atom_GetIVValue_LCUFN, 2);

  objptr = (struct LCInstance *)NativeAligned4FromLAddr(object);
  GET_IV_INDEX(objptr, iv, index, goto pnut);
  val = ((LispPTR *)NativeAligned4FromLAddr(objptr->iDescrs))[index];
  if (!LC_TYPEP(val, atom_annotatedValue)) return val;
pnut:
  RETCALL(atom_GetIVValue_LCUFN, 2);
  /*
    return LCGetActiveValue(object,val);
  */
}